

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_tile_data(_internal_exr_context *f,_internal_exr_part *curpart)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  exr_attr_tiledesc_t *peVar6;
  exr_attr_chlist_t *peVar7;
  exr_attr_chlist_entry_t *peVar8;
  bool bVar9;
  exr_result_t eVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  
  if ((curpart->storage_mode | EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_DEEP_TILED) {
    return 0;
  }
  if (curpart->tiles == (exr_attribute_t *)0x0) {
    bVar9 = false;
    eVar10 = (*f->print_error)(f,0xd,"\'tiles\' attribute for tiled file not found");
  }
  else {
    peVar6 = (curpart->tiles->field_6).tiledesc;
    uVar2 = peVar6->x_size;
    uVar12 = (ulong)uVar2;
    if ((uVar2 == 0) ||
       (uVar3 = peVar6->y_size, 0x1fffffff < uVar2 || uVar3 + 0xe0000000 < 0xe0000001)) {
      uVar16 = (ulong)peVar6->y_size;
      pcVar14 = "Invalid tile description size (%u x %u)";
    }
    else {
      uVar4 = f->max_tile_w;
      uVar5 = f->max_tile_h;
      uVar16 = (ulong)uVar5;
      peVar7 = (curpart->channels->field_6).chlist;
      bVar1 = peVar6->level_and_round;
      if (((int)uVar4 < 1) || ((int)uVar2 <= (int)uVar4)) {
        if (((int)uVar5 < 1) || ((int)uVar3 <= (int)uVar5)) {
          uVar12 = (ulong)(bVar1 & 0xf);
          if ((bVar1 & 0xf) < 3) {
            if (bVar1 < 0x20) {
              lVar11 = (long)peVar7->num_channels;
              bVar9 = true;
              if (0 < lVar11) {
                peVar8 = peVar7->entries;
                lVar11 = lVar11 * 0x20;
                lVar15 = 0;
                do {
                  if (*(int *)(peVar8->reserved + lVar15 + 3) != 1) {
                    uVar13 = *(undefined8 *)(peVar8->reserved + lVar15 + -0xd);
                    pcVar14 = "channel \'%s\': x subsampling factor is not 1 (%d) for a tiled image"
                    ;
LAB_0012a565:
                    bVar9 = false;
                    eVar10 = (*f->print_error)(f,0xe,pcVar14,uVar13);
                    goto LAB_0012a47d;
                  }
                  if (*(int *)(peVar8->reserved + lVar15 + 7) != 1) {
                    uVar13 = *(undefined8 *)(peVar8->reserved + lVar15 + -0xd);
                    pcVar14 = "channel \'%s\': y subsampling factor is not 1 (%d) for a tiled image"
                    ;
                    goto LAB_0012a565;
                  }
                  lVar15 = lVar15 + 0x20;
                } while (lVar11 != lVar15);
              }
              eVar10 = (exr_result_t)lVar11;
              goto LAB_0012a47d;
            }
            uVar12 = (ulong)(bVar1 >> 4);
            pcVar14 = "Invalid rounding mode (%d) in tile description header";
          }
          else {
            pcVar14 = "Invalid level mode (%d) in tile description header";
          }
          bVar9 = false;
          eVar10 = (*f->print_error)(f,0xe,pcVar14,uVar12);
          goto LAB_0012a47d;
        }
        pcVar14 = "Width of tile exceeds max size (%d vs max %d)";
        uVar12 = (ulong)uVar3;
      }
      else {
        pcVar14 = "Width of tile exceeds max size (%d vs max %d)";
        uVar16 = (ulong)uVar4;
      }
    }
    bVar9 = false;
    eVar10 = (*f->print_error)(f,0xe,pcVar14,uVar12,uVar16);
  }
LAB_0012a47d:
  if (bVar9) {
    return 0;
  }
  return eVar10;
}

Assistant:

static exr_result_t
validate_tile_data (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_TILED ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* desc;
        const int                  maxtilew = f->max_tile_w;
        const int                  maxtileh = f->max_tile_h;
        const exr_attr_chlist_t*   channels = curpart->channels->chlist;
        exr_tile_level_mode_t      levmode;
        exr_tile_round_mode_t      rndmode;

        if (!curpart->tiles)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'tiles' attribute for tiled file not found");

        desc    = curpart->tiles->tiledesc;
        levmode = EXR_GET_TILE_LEVEL_MODE (*desc);
        rndmode = EXR_GET_TILE_ROUND_MODE (*desc);

        if (desc->x_size == 0 || desc->y_size == 0 ||
            desc->x_size > (uint32_t) (INT_MAX / 4) ||
            desc->y_size > (uint32_t) (INT_MAX / 4))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid tile description size (%u x %u)",
                desc->x_size,
                desc->y_size);
        if (maxtilew > 0 && maxtilew < (int) (desc->x_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->x_size,
                maxtilew);
        if (maxtileh > 0 && maxtileh < (int) (desc->y_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->y_size,
                maxtileh);

        if ((int) levmode < EXR_TILE_ONE_LEVEL ||
            (int) levmode >= EXR_TILE_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid level mode (%d) in tile description header",
                (int) levmode);

        if ((int) rndmode < EXR_TILE_ROUND_DOWN ||
            (int) rndmode >= EXR_TILE_ROUND_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid rounding mode (%d) in tile description header",
                (int) rndmode);

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}